

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetExtensionIdentifierName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,FieldDescriptor *descriptor,
          bool immutable)

{
  Descriptor *descriptor_00;
  string *__rhs;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  byte local_21;
  FieldDescriptor *pFStack_20;
  bool immutable_local;
  FieldDescriptor *descriptor_local;
  ClassNameResolver *this_local;
  
  local_21 = immutable;
  pFStack_20 = descriptor;
  descriptor_local = (FieldDescriptor *)this;
  this_local = (ClassNameResolver *)__return_storage_ptr__;
  descriptor_00 = FieldDescriptor::containing_type(descriptor);
  GetClassName_abi_cxx11_(&local_68,this,descriptor_00,(bool)(local_21 & 1));
  std::operator+(&local_48,&local_68,".");
  __rhs = FieldDescriptor::name_abi_cxx11_(pFStack_20);
  std::operator+(__return_storage_ptr__,&local_48,__rhs);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

string ClassNameResolver::GetExtensionIdentifierName(
    const FieldDescriptor* descriptor, bool immutable) {
  return GetClassName(descriptor->containing_type(), immutable) + "." +
         descriptor->name();
}